

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_containers.h
# Opt level: O0

void __thiscall basisu::vector<unsigned_int>::set_all(vector<unsigned_int> *this,uint *o)

{
  uint uVar1;
  uint *puVar2;
  uint *pDst_end;
  uint *pDst;
  uint *o_local;
  vector<unsigned_int> *this_local;
  
  puVar2 = this->m_p;
  uVar1 = this->m_size;
  pDst = puVar2;
  while (pDst != puVar2 + uVar1) {
    *pDst = *o;
    pDst = pDst + 1;
  }
  return;
}

Assistant:

inline void set_all(const T& o)
      {
         if ((sizeof(T) == 1) && (scalar_type<T>::cFlag))
            memset(m_p, *reinterpret_cast<const uint8_t*>(&o), m_size);
         else
         {
            T* pDst = m_p;
            T* pDst_end = pDst + m_size;
            while (pDst != pDst_end)
               *pDst++ = o;
         }
      }